

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O1

void __thiscall
t_javame_generator::generate_java_struct_definition
          (t_javame_generator *this,ostream *out,t_struct *tstruct,bool is_exception,bool in_class,
          bool is_result)

{
  int *piVar1;
  t_field *field;
  pointer pcVar2;
  int iVar3;
  iterator iVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  pointer pptVar6;
  undefined4 extraout_var_00;
  t_type *ptVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined7 in_register_00000009;
  long lVar8;
  pointer pptVar9;
  t_struct *ptVar10;
  char *pcVar11;
  undefined7 in_register_00000089;
  long lVar12;
  bool bVar13;
  string field_name;
  key_type local_140;
  t_struct *local_120;
  undefined4 local_118;
  undefined4 local_114;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x22])();
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"final","");
  local_114 = (undefined4)CONCAT71(in_register_00000009,is_exception);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(tstruct->super_t_type).annotations_._M_t,&local_140);
  local_118 = (undefined4)CONCAT71(in_register_00000089,is_result);
  local_120 = tstruct;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"public ",7);
  lVar12 = 0;
  bVar13 = (_Rb_tree_header *)iVar4._M_node ==
           &(tstruct->super_t_type).annotations_._M_t._M_impl.super__Rb_tree_header;
  pcVar11 = "final ";
  if (bVar13) {
    pcVar11 = "";
  }
  lVar8 = 6;
  if (bVar13) {
    lVar8 = lVar12;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar11,lVar8);
  pcVar11 = "static ";
  if (in_class) {
    lVar12 = 7;
  }
  else {
    pcVar11 = "";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar11,lVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"class ",6);
  ptVar10 = local_120;
  iVar3 = (*(local_120->super_t_type).super_t_doc._vptr_t_doc[3])(local_120);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,*(char **)CONCAT44(extraout_var,iVar3),
                      ((undefined8 *)CONCAT44(extraout_var,iVar3))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
  if ((char)local_114 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(out,"extends Exception ",0x12);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"implements TBase ",0x11);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  generate_struct_desc(this,out,ptVar10);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  generate_field_descs(this,out,ptVar10);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  pptVar9 = (ptVar10->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pptVar6 = (ptVar10->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pptVar9 != pptVar6) {
    do {
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"private ",8);
      declare_field_abi_cxx11_(&local_140,this,*pptVar9,false);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_140._M_dataplus._M_p,local_140._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p);
      }
      pptVar9 = pptVar9 + 1;
      pptVar6 = (ptVar10->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    } while (pptVar9 != pptVar6);
  }
  if (pptVar6 !=
      (ptVar10->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"// isset id assignments",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    pptVar9 = (ptVar10->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pptVar9 ==
        (ptVar10->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      iVar3 = 0;
    }
    else {
      iVar3 = 0;
      do {
        bVar13 = type_can_be_null(this,(*pptVar9)->type_);
        if (!bVar13) {
          poVar5 = t_generator::indent((t_generator *)this,out);
          pcVar11 = "private static final int ";
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"private static final int ",0x19);
          isset_field_id_abi_cxx11_(&local_140,(t_javame_generator *)pcVar11,*pptVar9);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,local_140._M_dataplus._M_p,local_140._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,";",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) {
            operator_delete(local_140._M_dataplus._M_p);
          }
          iVar3 = iVar3 + 1;
        }
        pptVar9 = pptVar9 + 1;
      } while (pptVar9 !=
               (local_120->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    if (0 < iVar3) {
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"private boolean[] __isset_vector = new boolean[",0x2f);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"];",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    ptVar10 = local_120;
  }
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"public ",7);
  iVar3 = (*(ptVar10->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar10);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,*(char **)CONCAT44(extraout_var_00,iVar3),
                      ((undefined8 *)CONCAT44(extraout_var_00,iVar3))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"() {",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  pptVar9 = (ptVar10->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar9 ==
      (ptVar10->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar13 = true;
  }
  else {
    bVar13 = true;
    do {
      ptVar7 = t_type::get_true_type((*pptVar9)->type_);
      if ((*pptVar9)->value_ != (t_const_value *)0x0) {
        std::operator+(&local_50,"this.",&(*pptVar9)->name_);
        print_const_value(this,out,&local_50,ptVar7,(*pptVar9)->value_,true,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      if ((*pptVar9)->req_ != T_OPTIONAL) {
        bVar13 = false;
      }
      pptVar9 = pptVar9 + 1;
    } while (pptVar9 !=
             (local_120->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  ptVar10 = local_120;
  if (((local_120->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (local_120->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
       super__Vector_impl_data._M_finish) && (!bVar13)) {
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"public ",7);
    iVar3 = (*(ptVar10->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar10);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,*(char **)CONCAT44(extraout_var_01,iVar3),
                        ((undefined8 *)CONCAT44(extraout_var_01,iVar3))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    pptVar9 = (ptVar10->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pptVar9 !=
        (ptVar10->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      bVar13 = true;
      do {
        if ((*pptVar9)->req_ != T_OPTIONAL) {
          if (!bVar13) {
            std::__ostream_insert<char,std::char_traits<char>>(out,",",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          }
          poVar5 = t_generator::indent((t_generator *)this,out);
          type_name_abi_cxx11_(&local_140,this,(*pptVar9)->type_,false,false,false);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,local_140._M_dataplus._M_p,local_140._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,((*pptVar9)->name_)._M_dataplus._M_p,
                     ((*pptVar9)->name_)._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) {
            operator_delete(local_140._M_dataplus._M_p);
          }
          bVar13 = false;
        }
        pptVar9 = pptVar9 + 1;
      } while (pptVar9 !=
               (local_120->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"this();",7);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    pptVar9 = (local_120->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (pptVar9 !=
        (local_120->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        if ((*pptVar9)->req_ != T_OPTIONAL) {
          poVar5 = t_generator::indent((t_generator *)this,out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"this.",5);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,((*pptVar9)->name_)._M_dataplus._M_p,
                              ((*pptVar9)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,((*pptVar9)->name_)._M_dataplus._M_p,
                              ((*pptVar9)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,";",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          generate_isset_set(this,out,*pptVar9);
        }
        pptVar9 = pptVar9 + 1;
      } while (pptVar9 !=
               (local_120->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  ptVar10 = local_120;
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/**",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5," * Performs a deep copy on <i>other</i>.",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," */",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"public ",7);
  iVar3 = (*(ptVar10->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar10);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,*(char **)CONCAT44(extraout_var_02,iVar3),
                      ((undefined8 *)CONCAT44(extraout_var_02,iVar3))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(",1);
  iVar3 = (*(ptVar10->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar10);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,*(char **)CONCAT44(extraout_var_03,iVar3),
                      ((undefined8 *)CONCAT44(extraout_var_03,iVar3))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," other) {",9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  bVar13 = has_bit_vector(this,ptVar10);
  if (bVar13) {
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,
               "System.arraycopy(other.__isset_vector, 0, __isset_vector, 0, other.__isset_vector.length);"
               ,0x5a);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  pptVar9 = (ptVar10->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (; pptVar9 !=
         (ptVar10->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
         super__Vector_impl_data._M_finish; pptVar9 = pptVar9 + 1) {
    field = *pptVar9;
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    pcVar2 = (field->name_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_140,pcVar2,pcVar2 + (field->name_)._M_string_length);
    ptVar7 = field->type_;
    bVar13 = type_can_be_null(this,ptVar7);
    if (bVar13) {
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if (other.",10);
      generate_isset_check_abi_cxx11_(&local_b0,this,field);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,") {",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
    }
    iVar3 = (*(ptVar7->super_t_doc)._vptr_t_doc[0xd])(ptVar7);
    if ((char)iVar3 == '\0') {
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"this.",5);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_140._M_dataplus._M_p,local_140._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
      std::operator+(&local_90,"other.",&local_140);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,local_140._M_dataplus._M_p,
                 local_140._M_dataplus._M_p + local_140._M_string_length);
      generate_deep_copy_non_container(this,out,&local_90,&local_f0,ptVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,";",1);
      poVar5 = out;
    }
    else {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"other","");
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,local_140._M_dataplus._M_p,
                 local_140._M_dataplus._M_p + local_140._M_string_length);
      std::operator+(&local_70,"__this__",&local_140);
      generate_deep_copy_container(this,out,&local_d0,&local_110,&local_70,ptVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"this.",5);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_140._M_dataplus._M_p,local_140._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," = __this__",0xb);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_140._M_dataplus._M_p,local_140._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,";",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if (bVar13) {
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    ptVar10 = local_120;
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"public ",7);
  iVar3 = (*(ptVar10->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar10);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,*(char **)CONCAT44(extraout_var_04,iVar3),
                      ((undefined8 *)CONCAT44(extraout_var_04,iVar3))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," deepCopy() {",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  return new ",0xd);
  iVar3 = (*(ptVar10->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar10);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,*(char **)CONCAT44(extraout_var_05,iVar3),
                      ((undefined8 *)CONCAT44(extraout_var_05,iVar3))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(this);",7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  generate_java_struct_clear(this,out,ptVar10);
  poVar5 = out;
  generate_java_bean_boilerplate(this,out,ptVar10);
  generate_generic_field_getters_setters(this,poVar5,ptVar10);
  generate_java_struct_equality(this,out,ptVar10);
  generate_java_struct_compare_to(this,out,ptVar10);
  generate_java_struct_reader(this,out,ptVar10);
  if ((char)local_118 == '\0') {
    generate_java_struct_writer(this,out,ptVar10);
  }
  else {
    generate_java_struct_result_writer(this,out,ptVar10);
  }
  generate_java_struct_tostring(this,out,ptVar10);
  generate_java_validator(this,out,ptVar10);
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_javame_generator::generate_java_struct_definition(ostream& out,
                                                         t_struct* tstruct,
                                                         bool is_exception,
                                                         bool in_class,
                                                         bool is_result) {
  generate_java_doc(out, tstruct);

  bool is_final = (tstruct->annotations_.find("final") != tstruct->annotations_.end());

  indent(out) << "public " << (is_final ? "final " : "") << (in_class ? "static " : "") << "class "
              << tstruct->get_name() << " ";

  if (is_exception) {
    out << "extends Exception ";
  }
  out << "implements TBase ";

  scope_up(out);

  generate_struct_desc(out, tstruct);

  // Members are public for -java, private for -javabean
  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;

  out << endl;

  generate_field_descs(out, tstruct);

  out << endl;

  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    indent(out) << "private ";
    out << declare_field(*m_iter, false) << endl;
  }

  // isset data
  if (members.size() > 0) {
    out << endl;

    indent(out) << "// isset id assignments" << endl;

    int i = 0;
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      if (!type_can_be_null((*m_iter)->get_type())) {
        indent(out) << "private static final int " << isset_field_id(*m_iter) << " = " << i << ";"
                    << endl;
        i++;
      }
    }

    if (i > 0) {
      indent(out) << "private boolean[] __isset_vector = new boolean[" << i << "];" << endl;
    }

    out << endl;
  }

  bool all_optional_members = true;

  // Default constructor
  indent(out) << "public " << tstruct->get_name() << "() {" << endl;
  indent_up();
  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    t_type* t = get_true_type((*m_iter)->get_type());
    if ((*m_iter)->get_value() != nullptr) {
      print_const_value(out,
                        "this." + (*m_iter)->get_name(),
                        t,
                        (*m_iter)->get_value(),
                        true,
                        true);
    }
    if ((*m_iter)->get_req() != t_field::T_OPTIONAL) {
      all_optional_members = false;
    }
  }
  indent_down();
  indent(out) << "}" << endl << endl;

  if (!members.empty() && !all_optional_members) {
    // Full constructor for all fields
    indent(out) << "public " << tstruct->get_name() << "(" << endl;
    indent_up();
    bool first = true;
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      if ((*m_iter)->get_req() != t_field::T_OPTIONAL) {
        if (!first) {
          out << "," << endl;
        }
        first = false;
        indent(out) << type_name((*m_iter)->get_type()) << " " << (*m_iter)->get_name();
      }
    }
    out << ")" << endl;
    indent_down();
    indent(out) << "{" << endl;
    indent_up();
    indent(out) << "this();" << endl;
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      if ((*m_iter)->get_req() != t_field::T_OPTIONAL) {
        indent(out) << "this." << (*m_iter)->get_name() << " = " << (*m_iter)->get_name() << ";"
                    << endl;
        generate_isset_set(out, (*m_iter));
      }
    }
    indent_down();
    indent(out) << "}" << endl << endl;
  }

  // copy constructor
  indent(out) << "/**" << endl;
  indent(out) << " * Performs a deep copy on <i>other</i>." << endl;
  indent(out) << " */" << endl;
  indent(out) << "public " << tstruct->get_name() << "(" << tstruct->get_name() << " other) {"
              << endl;
  indent_up();

  if (has_bit_vector(tstruct)) {
    indent(out) << "System.arraycopy(other.__isset_vector, 0, __isset_vector, 0, "
                   "other.__isset_vector.length);" << endl;
  }

  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    t_field* field = (*m_iter);
    std::string field_name = field->get_name();
    t_type* type = field->get_type();
    bool can_be_null = type_can_be_null(type);

    if (can_be_null) {
      indent(out) << "if (other." << generate_isset_check(field) << ") {" << endl;
      indent_up();
    }

    if (type->is_container()) {
      generate_deep_copy_container(out, "other", field_name, "__this__" + field_name, type);
      indent(out) << "this." << field_name << " = __this__" << field_name << ";" << endl;
    } else {
      indent(out) << "this." << field_name << " = ";
      generate_deep_copy_non_container(out, "other." + field_name, field_name, type);
      out << ";" << endl;
    }

    if (can_be_null) {
      indent_down();
      indent(out) << "}" << endl;
    }
  }

  indent_down();
  indent(out) << "}" << endl << endl;

  // clone method, so that you can deep copy an object when you don't know its class.
  indent(out) << "public " << tstruct->get_name() << " deepCopy() {" << endl;
  indent(out) << "  return new " << tstruct->get_name() << "(this);" << endl;
  indent(out) << "}" << endl << endl;

  generate_java_struct_clear(out, tstruct);

  generate_java_bean_boilerplate(out, tstruct);
  generate_generic_field_getters_setters(out, tstruct);

  generate_java_struct_equality(out, tstruct);
  generate_java_struct_compare_to(out, tstruct);

  generate_java_struct_reader(out, tstruct);
  if (is_result) {
    generate_java_struct_result_writer(out, tstruct);
  } else {
    generate_java_struct_writer(out, tstruct);
  }
  generate_java_struct_tostring(out, tstruct);
  generate_java_validator(out, tstruct);
  scope_down(out);
  out << endl;
}